

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::IStreamingReporter::listTests
          (IStreamingReporter *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests,
          IConfig *config)

{
  TestCaseInfo *this_00;
  pointer pTVar1;
  int iVar2;
  ostream *poVar3;
  pointer pTVar4;
  char *pcVar5;
  Code _colourCode;
  Colour colourGuard;
  enable_if_t<_::Catch::Detail::IsStreamInsertable<SourceLineInfo>::value,_std::string> local_90;
  pointer local_70;
  undefined1 local_68 [40];
  size_t local_40;
  size_t local_38;
  
  iVar2 = (*config->_vptr_IConfig[0xe])(config);
  pcVar5 = "All available test cases:\n";
  if ((char)iVar2 != '\0') {
    pcVar5 = "Matching test cases:\n";
  }
  std::operator<<((ostream *)&std::cout,pcVar5);
  local_70 = (tests->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  for (pTVar4 = (tests->
                super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
                _M_impl.super__Vector_impl_data._M_start; pTVar4 != local_70; pTVar4 = pTVar4 + 1) {
    this_00 = pTVar4->m_info;
    _colourCode = None;
    if ((this_00->properties & IsHidden) != None) {
      _colourCode = FileName;
    }
    colourGuard.m_moved = false;
    Colour::use(_colourCode);
    TextFlow::Column::Column((Column *)local_68,&this_00->name);
    local_38 = 2;
    local_40 = 4;
    TextFlow::operator<<((ostream *)&std::cout,(Column *)local_68);
    std::operator<<((ostream *)&std::cout,'\n');
    std::__cxx11::string::~string((string *)local_68);
    iVar2 = (*config->_vptr_IConfig[0x14])(config);
    if (1 < iVar2) {
      StringMaker<Catch::SourceLineInfo,_void>::convert<Catch::SourceLineInfo>
                (&local_90,&this_00->lineInfo);
      TextFlow::Column::Column((Column *)local_68,&local_90);
      local_40 = 4;
      TextFlow::operator<<((ostream *)&std::cout,(Column *)local_68);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::__cxx11::string::~string((string *)local_68);
      std::__cxx11::string::~string((string *)&local_90);
    }
    if ((this_00->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this_00->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar2 = (*config->_vptr_IConfig[0x14])(config);
      if (0 < iVar2) {
        TestCaseInfo::tagsAsString_abi_cxx11_(&local_90,this_00);
        TextFlow::Column::Column((Column *)local_68,&local_90);
        local_40 = 6;
        TextFlow::operator<<((ostream *)&std::cout,(Column *)local_68);
        std::operator<<((ostream *)&std::cout,'\n');
        std::__cxx11::string::~string((string *)local_68);
        std::__cxx11::string::~string((string *)&local_90);
      }
    }
    Colour::~Colour(&colourGuard);
  }
  iVar2 = (*config->_vptr_IConfig[0xe])(config);
  if ((char)iVar2 == '\0') {
    pTVar4 = (tests->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pTVar1 = (tests->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"test case",(allocator<char> *)&colourGuard);
    local_68._0_8_ = (long)pTVar1 - (long)pTVar4 >> 4;
    std::__cxx11::string::string((string *)(local_68 + 8),(string *)&local_90);
    Catch::operator<<((ostream *)&std::cout,(pluralise *)local_68);
    poVar3 = std::operator<<((ostream *)&std::cout,'\n');
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    pTVar4 = (tests->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pTVar1 = (tests->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"matching test case",(allocator<char> *)&colourGuard);
    local_68._0_8_ = (long)pTVar1 - (long)pTVar4 >> 4;
    std::__cxx11::string::string((string *)(local_68 + 8),(string *)&local_90);
    Catch::operator<<((ostream *)&std::cout,(pluralise *)local_68);
    poVar3 = std::operator<<((ostream *)&std::cout,'\n');
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__cxx11::string::~string((string *)(local_68 + 8));
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void IStreamingReporter::listTests(std::vector<TestCaseHandle> const &tests, IConfig const &config) {
        if (config.hasTestFilters()) {
            Catch::cout() << "Matching test cases:\n";
        }
        else {
            Catch::cout() << "All available test cases:\n";
        }

        for (auto const &test : tests) {
            auto const &testCaseInfo = test.getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            Colour colourGuard(colour);

            Catch::cout() << TextFlow::Column(testCaseInfo.name).initialIndent(2).indent(4) << '\n';
            if (config.verbosity() >= Verbosity::High) {
                Catch::cout() << TextFlow::Column(Catch::Detail::stringify(testCaseInfo.lineInfo)).indent(4) << std::endl;
            }
            if (!testCaseInfo.tags.empty() && config.verbosity() > Verbosity::Quiet) {
                Catch::cout() << TextFlow::Column(testCaseInfo.tagsAsString()).indent(6) << '\n';
            }
        }

        if (!config.hasTestFilters()) {
            Catch::cout() << pluralise(tests.size(), "test case") << '\n' << std::endl;
        }
        else {
            Catch::cout() << pluralise(tests.size(), "matching test case") << '\n' << std::endl;
        }
    }